

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O1

void __thiscall
NodeParser::parseQualSource
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int t;
  int iVar4;
  Pattern *p;
  InputError *pIVar5;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  double local_38;
  double b;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    InputError::InputError(pIVar5,2,&local_d8);
    __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
  }
  t = Utilities::findMatch(pbVar1 + 1,QualSource::SourceTypeWords);
  if (t < 0) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    pcVar2 = pbVar1[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
    InputError::InputError(pIVar5,3,&local_b8);
    __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar3 = Utilities::parseNumber<double>(pbVar1 + 2,&local_38);
  if (!bVar3) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar2 = pbVar1[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
    InputError::InputError(pIVar5,6,&local_98);
    __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
  }
  if (0x60 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokenList->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    iVar4 = std::__cxx11::string::compare((char *)(pbVar1 + 3));
    if (iVar4 != 0) {
      p = Network::pattern(nw,pbVar1 + 3);
      if (p == (Pattern *)0x0) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = pbVar1[3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
        InputError::InputError(pIVar5,5,&local_78);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      goto LAB_00135d5e;
    }
  }
  p = (Pattern *)0x0;
LAB_00135d5e:
  bVar3 = QualSource::addSource(node,t,local_38,p);
  if (bVar3) {
    return;
  }
  pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Node Source","");
  InputError::InputError(pIVar5,1,&local_58);
  __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void NodeParser::parseQualSource(Node* node, Network* nw, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - source type keyword
    // 2 - baseline source strength
    // 3 - time pattern ID (optional)

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read source type

    int t = Utilities::findMatch(tokens[1], QualSource::SourceTypeWords);
    if (t < 0) throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    // ... read baseline source strength

    double b;
    if ( !Utilities::parseNumber(tokens[2], b) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }

    // ... read optional pattern name

    Pattern* p = 0;
    if ( tokenList.size() > 3 && tokens[3] != "*")
    {
        p = nw->pattern(tokens[3]);
        if (p == nullptr) throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
    }

    // ... add a water quality source to the node

    if ( !QualSource::addSource(node, t, b, p) )
    {
        throw InputError(InputError::CANNOT_CREATE_OBJECT, "Node Source");
    }
}